

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

arth * gen_arth(compiler_state_t *cstate,int code,arth *a0,arth *a1)

{
  int iVar1;
  slist *psVar2;
  slist *s0_00;
  slist *s1_00;
  slist *s2;
  slist *s1;
  slist *s0;
  arth *a1_local;
  arth *a0_local;
  int code_local;
  compiler_state_t *cstate_local;
  
  if (code == 0x30) {
    if (((a1->s->s).code == 0) && ((a1->s->s).k == 0)) {
      bpf_error(cstate,"division by zero");
    }
  }
  else if (((code == 0x90) && ((a1->s->s).code == 0)) && ((a1->s->s).k == 0)) {
    bpf_error(cstate,"modulus by zero");
  }
  psVar2 = xfer_to_x(cstate,a1);
  s0_00 = xfer_to_a(cstate,a0);
  s1_00 = new_stmt(cstate,code | 0xc);
  sappend(s0_00,s1_00);
  sappend(psVar2,s0_00);
  sappend(a1->s,psVar2);
  sappend(a0->s,a1->s);
  free_reg(cstate,a0->regno);
  free_reg(cstate,a1->regno);
  psVar2 = new_stmt(cstate,2);
  iVar1 = alloc_reg(cstate);
  (psVar2->s).k = iVar1;
  a0->regno = iVar1;
  sappend(a0->s,psVar2);
  return a0;
}

Assistant:

struct arth *
gen_arth(compiler_state_t *cstate, int code, struct arth *a0,
    struct arth *a1)
{
	struct slist *s0, *s1, *s2;

	/*
	 * Disallow division by, or modulus by, zero; we do this here
	 * so that it gets done even if the optimizer is disabled.
	 */
	if (code == BPF_DIV) {
		if (a1->s->s.code == (BPF_LD|BPF_IMM) && a1->s->s.k == 0)
			bpf_error(cstate, "division by zero");
	} else if (code == BPF_MOD) {
		if (a1->s->s.code == (BPF_LD|BPF_IMM) && a1->s->s.k == 0)
			bpf_error(cstate, "modulus by zero");
	}
	s0 = xfer_to_x(cstate, a1);
	s1 = xfer_to_a(cstate, a0);
	s2 = new_stmt(cstate, BPF_ALU|BPF_X|code);

	sappend(s1, s2);
	sappend(s0, s1);
	sappend(a1->s, s0);
	sappend(a0->s, a1->s);

	free_reg(cstate, a0->regno);
	free_reg(cstate, a1->regno);

	s0 = new_stmt(cstate, BPF_ST);
	a0->regno = s0->s.k = alloc_reg(cstate);
	sappend(a0->s, s0);

	return a0;
}